

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lgc.c
# Opt level: O0

void convergeephemerons(global_State *g)

{
  Table *pTVar1;
  bool bVar2;
  int iVar3;
  Table *local_28;
  GCObject *next;
  GCObject *w;
  int changed;
  global_State *g_local;
  
  do {
    local_28 = (Table *)g->ephemeron;
    g->ephemeron = (GCObject *)0x0;
    bVar2 = false;
    while (local_28 != (Table *)0x0) {
      pTVar1 = (Table *)local_28->gclist;
      iVar3 = traverseephemeron(g,local_28);
      local_28 = pTVar1;
      if (iVar3 != 0) {
        propagateall(g);
        bVar2 = true;
      }
    }
  } while (bVar2);
  return;
}

Assistant:

static void convergeephemerons(global_State *g) {
    int changed;
    do {
        GCObject *w;
        GCObject *next = g->ephemeron;  /* get ephemeron list */
        g->ephemeron = NULL;  /* tables may return to this list when traversed */
        changed = 0;
        while ((w = next) != NULL) {
            next = gco2t(w)->gclist;
            if (traverseephemeron(g, gco2t(w))) {  /* traverse marked some value? */
                propagateall(g);  /* propagate changes */
                changed = 1;  /* will have to revisit all ephemeron tables */
            }
        }
    } while (changed);
}